

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_aligned.h
# Opt level: O3

void __thiscall
embree::avx::HeuristicArrayBinningSAH<embree::PrimRef,_32UL>::splitByGeometry
          (HeuristicArrayBinningSAH<embree::PrimRef,_32UL> *this,range<unsigned_long> *range,
          PrimInfoRange *linfo,PrimInfoRange *rinfo)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  float fVar3;
  PrimRef *pPVar4;
  unsigned_long uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  PrimRef *pPVar17;
  unsigned_long uVar18;
  PrimRef *pPVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  undefined1 auVar21 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  undefined1 auVar23 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  pPVar4 = this->prims;
  pPVar17 = pPVar4 + range->_begin;
  fVar3 = pPVar4[range->_begin].lower.field_0.m128[3];
  pPVar19 = pPVar4 + range->_end;
  auVar27._8_4_ = 0x7f800000;
  auVar27._0_8_ = 0x7f8000007f800000;
  auVar27._12_4_ = 0x7f800000;
  auVar26._8_4_ = 0xff800000;
  auVar26._0_8_ = 0xff800000ff800000;
  auVar26._12_4_ = 0xff800000;
  auVar31 = auVar26;
  auVar6 = auVar26;
  auVar8 = auVar27;
  auVar30 = auVar27;
  auVar9 = auVar27;
  auVar7 = auVar26;
  do {
    auVar29 = ZEXT1664(auVar30);
    auVar25 = ZEXT1664(auVar31);
    auVar23 = ZEXT1664(auVar27);
    auVar21 = ZEXT1664(auVar26);
    pPVar19 = pPVar19 + -1;
    while ((pPVar17 <= pPVar19 && ((pPVar17->lower).field_0.m128[3] == fVar3))) {
      aVar1 = (pPVar17->lower).field_0.field_1;
      aVar2 = (pPVar17->upper).field_0.field_1;
      auVar8 = vminps_avx(auVar8,(undefined1  [16])aVar1);
      auVar6 = vmaxps_avx(auVar6,(undefined1  [16])aVar2);
      auVar30._0_4_ = aVar1.x + aVar2.x;
      auVar30._4_4_ = aVar1.y + aVar2.y;
      auVar30._8_4_ = aVar1.z + aVar2.z;
      auVar30._12_4_ = aVar1.field_3.w + aVar2.field_3.w;
      auVar9 = vminps_avx(auVar9,auVar30);
      auVar7 = vmaxps_avx(auVar7,auVar30);
      pPVar17 = pPVar17 + 1;
    }
    while( true ) {
      aVar28 = auVar29._0_16_;
      aVar24 = auVar25._0_16_;
      aVar22 = auVar23._0_16_;
      aVar20 = auVar21._0_16_;
      if (pPVar19 < pPVar17) {
        uVar18 = (long)pPVar17 - (long)pPVar4 >> 5;
        uVar5 = range->_begin;
        *(undefined1 (*) [16])(linfo->super_CentGeomBBox3fa).geomBounds.lower.field_0.m128 = auVar8;
        *(undefined1 (*) [16])(linfo->super_CentGeomBBox3fa).geomBounds.upper.field_0.m128 = auVar6;
        *(undefined1 (*) [16])(linfo->super_CentGeomBBox3fa).centBounds.lower.field_0.m128 = auVar9;
        *(undefined1 (*) [16])(linfo->super_CentGeomBBox3fa).centBounds.upper.field_0.m128 = auVar7;
        (linfo->super_range<unsigned_long>)._begin = uVar5;
        (linfo->super_range<unsigned_long>)._end = uVar18;
        uVar5 = range->_end;
        (rinfo->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar28;
        (rinfo->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar24;
        (rinfo->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar22;
        (rinfo->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar20;
        (rinfo->super_range<unsigned_long>)._begin = uVar18;
        (rinfo->super_range<unsigned_long>)._end = uVar5;
        return;
      }
      aVar1 = (pPVar19->lower).field_0.field_1;
      aVar2 = (pPVar19->upper).field_0.field_1;
      auVar31._0_4_ = aVar1.x + aVar2.x;
      auVar31._4_4_ = aVar1.y + aVar2.y;
      auVar31._8_4_ = aVar1.z + aVar2.z;
      auVar31._12_4_ = aVar1.field_3.w + aVar2.field_3.w;
      if ((pPVar19->lower).field_0.m128[3] == fVar3) break;
      auVar26 = vminps_avx((undefined1  [16])aVar28,(undefined1  [16])aVar1);
      auVar29 = ZEXT1664(auVar26);
      auVar26 = vmaxps_avx((undefined1  [16])aVar24,(undefined1  [16])aVar2);
      auVar25 = ZEXT1664(auVar26);
      auVar26 = vminps_avx((undefined1  [16])aVar22,auVar31);
      auVar23 = ZEXT1664(auVar26);
      auVar31 = vmaxps_avx((undefined1  [16])aVar20,auVar31);
      auVar21 = ZEXT1664(auVar31);
      pPVar19 = pPVar19 + -1;
    }
    auVar8 = vminps_avx(auVar8,(undefined1  [16])aVar1);
    auVar6 = vmaxps_avx(auVar6,(undefined1  [16])aVar2);
    auVar9 = vminps_avx(auVar9,auVar31);
    auVar7 = vmaxps_avx(auVar7,auVar31);
    aVar1 = (pPVar17->lower).field_0.field_1;
    aVar2 = (pPVar17->upper).field_0.field_1;
    auVar30 = vminps_avx((undefined1  [16])aVar28,(undefined1  [16])aVar1);
    auVar31 = vmaxps_avx((undefined1  [16])aVar24,(undefined1  [16])aVar2);
    auVar32._0_4_ = aVar1.x + aVar2.x;
    auVar32._4_4_ = aVar1.y + aVar2.y;
    auVar32._8_4_ = aVar1.z + aVar2.z;
    auVar32._12_4_ = aVar1.field_3.w + aVar2.field_3.w;
    auVar27 = vminps_avx((undefined1  [16])aVar22,auVar32);
    auVar26 = vmaxps_avx((undefined1  [16])aVar20,auVar32);
    uVar10 = *(undefined8 *)&(pPVar17->lower).field_0;
    uVar11 = *(undefined8 *)((long)&(pPVar17->lower).field_0 + 8);
    uVar12 = *(undefined8 *)&(pPVar17->upper).field_0;
    uVar13 = *(undefined8 *)((long)&(pPVar17->upper).field_0 + 8);
    uVar14 = *(undefined8 *)((long)&(pPVar19->lower).field_0 + 8);
    uVar15 = *(undefined8 *)&(pPVar19->upper).field_0;
    uVar16 = *(undefined8 *)((long)&(pPVar19->upper).field_0 + 8);
    *(undefined8 *)&(pPVar17->lower).field_0 = *(undefined8 *)&(pPVar19->lower).field_0;
    *(undefined8 *)((long)&(pPVar17->lower).field_0 + 8) = uVar14;
    *(undefined8 *)&(pPVar17->upper).field_0 = uVar15;
    *(undefined8 *)((long)&(pPVar17->upper).field_0 + 8) = uVar16;
    *(undefined8 *)&(pPVar19->lower).field_0 = uVar10;
    *(undefined8 *)((long)&(pPVar19->lower).field_0 + 8) = uVar11;
    *(undefined8 *)&(pPVar19->upper).field_0 = uVar12;
    *(undefined8 *)((long)&(pPVar19->upper).field_0 + 8) = uVar13;
    pPVar17 = pPVar17 + 1;
  } while( true );
}

Assistant:

void splitByGeometry(const range<size_t>& range, PrimInfoRange& linfo, PrimInfoRange& rinfo)
        {
          assert(range.size() > 1);
          CentGeomBBox3fa left(empty);
          CentGeomBBox3fa right(empty);
          unsigned int geomID = prims[range.begin()].geomID();
          size_t center = serial_partitioning(prims,range.begin(),range.end(),left,right,
                                              [&] ( const PrimRef& prim ) { return prim.geomID() == geomID; },
                                              [ ] ( CentGeomBBox3fa& a, const PrimRef& ref ) { a.extend_center2(ref); });

          new (&linfo) PrimInfoRange(range.begin(),center,left);
          new (&rinfo) PrimInfoRange(center,range.end(),right);
        }